

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void reclaim_rollback_point_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *__format;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  void *value_out;
  char keybuf [16];
  size_t valuelen_out;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  fdb_kvs_handle *local_1d0;
  fdb_file_handle *local_1c8;
  void *local_1c0;
  char local_1b8 [24];
  size_t local_1a0;
  fdb_kvs_config local_198;
  timeval local_180;
  fdb_file_info local_170;
  fdb_config local_128;
  
  memleak_start();
  gettimeofday(&local_180,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  staleblktest* > errorlog.txt");
  local_128.compaction_threshold = '\0';
  local_128.num_keeping_headers = 5;
  fVar2 = fdb_open(&local_1c8,"./staleblktest1",&local_128);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f20b;
  fVar2 = fdb_kvs_open(local_1c8,&local_1d0,"db",&local_198);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f212;
  uVar6 = 0;
  do {
    sprintf(local_1b8,"key%d",uVar6);
    pfVar1 = local_1d0;
    sVar3 = strlen(local_1b8);
    fVar2 = fdb_set_kv(pfVar1,local_1b8,sVar3,"reu",4);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      reclaim_rollback_point_test();
      goto LAB_0010f1cc;
    }
    uVar4 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar4;
  } while (uVar4 != 30000);
  fVar2 = fdb_commit(local_1c8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f219;
  do {
    fVar2 = fdb_set_kv(local_1d0,"key",4,"val",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f1d3;
    fVar2 = fdb_get_file_info(local_1c8,&local_170);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f1cc;
  } while (local_170.file_size < 0x1000001);
  fVar2 = fdb_commit(local_1c8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f220;
  uVar4 = 0;
  do {
    sprintf(local_1b8,"key%d",(ulong)uVar4);
    pfVar1 = local_1d0;
    sVar3 = strlen(local_1b8);
    fVar2 = fdb_set_kv(pfVar1,local_1b8,sVar3,"reu2",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f1da;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 30000);
  fVar2 = fdb_commit(local_1c8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f227;
  fVar2 = fdb_rollback(&local_1d0,30000);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f22e;
  uVar4 = 0;
  do {
    sprintf(local_1b8,"key%d",(ulong)uVar4);
    pfVar1 = local_1d0;
    sVar3 = strlen(local_1b8);
    fVar2 = fdb_get_kv(pfVar1,local_1b8,sVar3,&local_1c0,&local_1a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f1e1;
    free(local_1c0);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 30000);
  uVar4 = 0;
  do {
    sprintf(local_1b8,"key%d",(ulong)uVar4);
    pfVar1 = local_1d0;
    sVar3 = strlen(local_1b8);
    fVar2 = fdb_set_kv(pfVar1,local_1b8,sVar3,"reu",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f1ef;
    fVar2 = fdb_commit(local_1c8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f1e8;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 5);
  iVar5 = 30000;
  do {
    fVar2 = fdb_set_kv(local_1d0,"key",4,"val",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f1f6;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  fVar2 = fdb_commit(local_1c8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f235;
  iVar5 = 30000;
  do {
    fVar2 = fdb_set_kv(local_1d0,"key",4,"val",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f1fd;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  fVar2 = fdb_commit(local_1c8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f23c;
  uVar4 = 0;
  do {
    sprintf(local_1b8,"key%d",(ulong)uVar4);
    pfVar1 = local_1d0;
    sVar3 = strlen(local_1b8);
    fVar2 = fdb_get_kv(pfVar1,local_1b8,sVar3,&local_1c0,&local_1a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f204;
    free(local_1c0);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 30000);
  fVar2 = fdb_kvs_close(local_1d0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_close(local_1c8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (reclaim_rollback_point_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"reclaim rollback point test");
      return;
    }
    goto LAB_0010f24a;
  }
  goto LAB_0010f243;
LAB_0010f1cc:
  reclaim_rollback_point_test();
LAB_0010f1d3:
  reclaim_rollback_point_test();
LAB_0010f1da:
  reclaim_rollback_point_test();
LAB_0010f1e1:
  reclaim_rollback_point_test();
LAB_0010f1e8:
  reclaim_rollback_point_test();
LAB_0010f1ef:
  reclaim_rollback_point_test();
LAB_0010f1f6:
  reclaim_rollback_point_test();
LAB_0010f1fd:
  reclaim_rollback_point_test();
LAB_0010f204:
  reclaim_rollback_point_test();
LAB_0010f20b:
  reclaim_rollback_point_test();
LAB_0010f212:
  reclaim_rollback_point_test();
LAB_0010f219:
  reclaim_rollback_point_test();
LAB_0010f220:
  reclaim_rollback_point_test();
LAB_0010f227:
  reclaim_rollback_point_test();
LAB_0010f22e:
  reclaim_rollback_point_test();
LAB_0010f235:
  reclaim_rollback_point_test();
LAB_0010f23c:
  reclaim_rollback_point_test();
LAB_0010f243:
  reclaim_rollback_point_test();
LAB_0010f24a:
  reclaim_rollback_point_test();
  verify_stale_block_reuse_test();
  verify_staleblock_reuse_param_test();
  reuse_with_snapshot_test();
  verify_minimum_num_keeping_headers_param_test();
  verify_high_num_keeping_headers_param_test();
  snapshot_before_block_reuse_test(false);
  snapshot_before_block_reuse_test(true);
  snapshot_after_block_reuse_test();
  variable_value_size_test();
  rollback_with_num_keeping_headers();
  reuse_on_delete_test();
  fragmented_reuse_test();
  enter_reuse_via_separate_kvs_test();
  superblock_recovery_test();
  crash_and_recover_with_num_keeping_test();
  reclaim_rollback_point_test();
  return;
}

Assistant:

void reclaim_rollback_point_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=5;
    int ndocs=30000;
    char keybuf[16];

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    void *value_out;
    size_t valuelen_out;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load n docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // overwrite n docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu2", 5);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // rollback to the first commit
    status = fdb_rollback(&db, low_seq);
    TEST_STATUS(status);

    // retrieve docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value_out, &valuelen_out);
        TEST_STATUS(status);
        free(value_out);
    }

    // create nheaders
    for (i = 0; i < nheaders; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // append some data & commit
    // now old blocks will be reclaimed
    for (i=0; i<ndocs; ++i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // append more data .. now reusable blocks are overwritten
    for (i=0; i<ndocs; ++i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // retrieve docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value_out, &valuelen_out);
        TEST_STATUS(status);
        free(value_out);
    }

    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("reclaim rollback point test");
}